

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::SetPolymorphicInlineCache
          (EntryPointPolymorphicInlineCacheInfo *this,FunctionBody *functionBody,uint index,
          PolymorphicInlineCache *polymorphicInlineCache,bool isInlinee,byte polyCacheUtil)

{
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  PolymorphicInlineCacheInfo *pPVar3;
  undefined4 *puVar4;
  char *message;
  char *error;
  uint lineNumber;
  undefined7 in_register_00000081;
  
  recycler = ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
             recycler;
  if ((int)CONCAT71(in_register_00000081,isInlinee) == 0) {
    InlineCachePointerArray<Js::PolymorphicInlineCache>::SetInlineCache
              ((InlineCachePointerArray<Js::PolymorphicInlineCache> *)this,recycler,functionBody,
               index,polymorphicInlineCache);
    PolymorphicCacheUtilizationArray::SetUtil
              (&(this->selfInfo).polymorphicCacheUtilizationArray,functionBody,index,polyCacheUtil);
    if ((this->selfInfo).functionBody.ptr == functionBody) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    error = "(functionBody == selfInfo.GetFunctionBody())";
    message = "functionBody == selfInfo.GetFunctionBody()";
    lineNumber = 0x1fcf;
  }
  else {
    pPVar3 = EnsureInlineeInfo(this,recycler,functionBody);
    InlineCachePointerArray<Js::PolymorphicInlineCache>::SetInlineCache
              (&pPVar3->polymorphicInlineCaches,
               ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
               recycler,functionBody,index,polymorphicInlineCache);
    PolymorphicCacheUtilizationArray::SetUtil
              (&pPVar3->polymorphicCacheUtilizationArray,functionBody,index,polyCacheUtil);
    pPVar3 = GetInlineeInfo(this,functionBody);
    if ((pPVar3->functionBody).ptr == functionBody) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    error = "(functionBody == GetInlineeInfo(functionBody)->GetFunctionBody())";
    message = "functionBody == GetInlineeInfo(functionBody)->GetFunctionBody()";
    lineNumber = 0x1fd4;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                              ,lineNumber,error,message);
  if (bVar2) {
    *puVar4 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void EntryPointPolymorphicInlineCacheInfo::SetPolymorphicInlineCache(FunctionBody * functionBody, uint index, PolymorphicInlineCache * polymorphicInlineCache, bool isInlinee, byte polyCacheUtil)
    {
        if (!isInlinee)
        {
            SetPolymorphicInlineCache(&selfInfo, functionBody, index, polymorphicInlineCache, polyCacheUtil);
            Assert(functionBody == selfInfo.GetFunctionBody());
        }
        else
        {
            SetPolymorphicInlineCache(EnsureInlineeInfo(functionBody->GetScriptContext()->GetRecycler(), functionBody), functionBody, index, polymorphicInlineCache, polyCacheUtil);
            Assert(functionBody == GetInlineeInfo(functionBody)->GetFunctionBody());
        }
    }